

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtTaskScheduler.cpp
# Opt level: O2

void __thiscall cbtTaskSchedulerDefault::~cbtTaskSchedulerDefault(cbtTaskSchedulerDefault *this)

{
  int in_ESI;
  long lVar1;
  long lVar2;
  
  (this->super_cbtITaskScheduler)._vptr_cbtITaskScheduler =
       (_func_int **)&PTR__cbtTaskSchedulerDefault_01197df0;
  waitForWorkersToSleep(this);
  lVar1 = 0;
  for (lVar2 = 0; lVar2 < (this->m_jobQueues).m_size; lVar2 = lVar2 + 1) {
    JobQueue::exit((JobQueue *)(((this->m_jobQueues).m_data)->m_cachePadding + lVar1 + -0x78),in_ESI
                  );
    lVar1 = lVar1 + 0xb8;
  }
  if (this->m_threadSupport != (cbtThreadSupportInterface *)0x0) {
    (*this->m_threadSupport->_vptr_cbtThreadSupportInterface[1])();
    this->m_threadSupport = (cbtThreadSupportInterface *)0x0;
  }
  if (this->m_workerDirective != (WorkerThreadDirectives *)0x0) {
    cbtAlignedFreeInternal(this->m_workerDirective);
    this->m_workerDirective = (WorkerThreadDirectives *)0x0;
  }
  cbtClock::~cbtClock(&this->m_clock);
  cbtAlignedObjectArray<ThreadLocalStorage>::~cbtAlignedObjectArray(&this->m_threadLocalStorage);
  cbtAlignedObjectArray<JobQueue_*>::~cbtAlignedObjectArray(&this->m_perThreadJobQueues);
  cbtAlignedObjectArray<JobQueue>::~cbtAlignedObjectArray(&this->m_jobQueues);
  return;
}

Assistant:

virtual ~cbtTaskSchedulerDefault()
	{
		waitForWorkersToSleep();

		for (int i = 0; i < m_jobQueues.size(); ++i)
		{
			m_jobQueues[i].exit();
		}

		if (m_threadSupport)
		{
			delete m_threadSupport;
			m_threadSupport = NULL;
		}
		if (m_workerDirective)
		{
			cbtAlignedFree(m_workerDirective);
			m_workerDirective = NULL;
		}
	}